

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O2

Stream * rw::writeMaterialMatFX
                   (Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int iVar1;
  long lVar2;
  Texture *pTVar3;
  long lVar4;
  
  lVar2 = *(long *)((long)object + (long)offset);
  Stream::writeU32(stream,*(uint32 *)(lVar2 + 0x50));
  lVar4 = 0x20;
  do {
    if (lVar4 == 0x70) {
      return stream;
    }
    Stream::writeU32(stream,*(uint32 *)(lVar2 + -0x20 + lVar4));
    iVar1 = *(int *)(lVar2 + -0x20 + lVar4);
    if (iVar1 == 4) {
      Stream::writeI32(stream,*(int32 *)(lVar2 + -0x10 + lVar4));
      Stream::writeI32(stream,*(int32 *)(lVar2 + -0xc + lVar4));
      Stream::writeI32(stream,(uint)(*(long *)(lVar2 + -0x18 + lVar4) != 0));
      pTVar3 = *(Texture **)(lVar2 + -0x18 + lVar4);
LAB_0012add7:
      if (pTVar3 != (Texture *)0x0) {
        Texture::streamWrite(pTVar3,stream);
      }
    }
    else {
      if (iVar1 == 2) {
        Stream::writeF32(stream,*(float32 *)(lVar2 + -8 + lVar4));
        Stream::writeI32(stream,*(int32 *)(lVar2 + -4 + lVar4));
        Stream::writeI32(stream,(uint)(*(long *)(lVar2 + -0x10 + lVar4) != 0));
        pTVar3 = *(Texture **)(lVar2 + -0x10 + lVar4);
        goto LAB_0012add7;
      }
      if (iVar1 == 1) {
        Stream::writeF32(stream,*(float32 *)(lVar2 + lVar4));
        Stream::writeI32(stream,(uint)(*(long *)(lVar2 + -0x10 + lVar4) != 0));
        pTVar3 = *(Texture **)(lVar2 + -0x10 + lVar4);
        if (pTVar3 != (Texture *)0x0) {
          Texture::streamWrite(pTVar3,stream);
        }
        Stream::writeI32(stream,(uint)(*(long *)(lVar2 + -8 + lVar4) != 0));
        pTVar3 = *(Texture **)(lVar2 + -8 + lVar4);
        goto LAB_0012add7;
      }
    }
    lVar4 = lVar4 + 0x28;
  } while( true );
}

Assistant:

static Stream*
writeMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);

	stream->writeU32(matfx->type);
	for(int i = 0; i < 2; i++){
		stream->writeU32(matfx->fx[i].type);
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			stream->writeF32(matfx->fx[i].bump.coefficient);
			stream->writeI32(matfx->fx[i].bump.bumpedTex != nil);
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->streamWrite(stream);
			stream->writeI32(matfx->fx[i].bump.tex != nil);
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->streamWrite(stream);
			break;

		case MatFX::ENVMAP:
			stream->writeF32(matfx->fx[i].env.coefficient);
			stream->writeI32(matfx->fx[i].env.fbAlpha);
			stream->writeI32(matfx->fx[i].env.tex != nil);
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->streamWrite(stream);
			break;

		case MatFX::DUAL:
			stream->writeI32(matfx->fx[i].dual.srcBlend);
			stream->writeI32(matfx->fx[i].dual.dstBlend);
			stream->writeI32(matfx->fx[i].dual.tex != nil);
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->streamWrite(stream);
			break;
		}
	}
	return stream;
}